

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_html_generator.cc
# Opt level: O1

void __thiscall t_html_generator::generate_css(t_html_generator *this)

{
  ofstream_with_content_based_conditional_update *this_00;
  long *plVar1;
  _Base_ptr *pp_Var2;
  ofstream_with_content_based_conditional_update *poVar3;
  string css_fname;
  allocator local_61;
  t_html_generator *local_60 [2];
  undefined1 local_50 [24];
  _Base_ptr local_38;
  _Base_ptr local_30;
  _Base_ptr p_Stack_28;
  
  if (this->standalone_ == false) {
    std::__cxx11::string::_M_replace
              ((ulong)&this->current_file_,0,(char *)(this->current_file_)._M_string_length,0x38e0e1
              );
    (*(this->super_t_generator)._vptr_t_generator[0x1b])(local_60,this);
    plVar1 = (long *)std::__cxx11::string::_M_append
                               ((char *)local_60,(ulong)(this->current_file_)._M_dataplus._M_p);
    pp_Var2 = (_Base_ptr *)(plVar1 + 2);
    if ((_Base_ptr *)*plVar1 == pp_Var2) {
      local_30 = *pp_Var2;
      p_Stack_28 = (_Base_ptr)plVar1[3];
      local_50._16_8_ = &local_30;
    }
    else {
      local_30 = *pp_Var2;
      local_50._16_8_ = (_Base_ptr *)*plVar1;
    }
    local_38 = (_Base_ptr)plVar1[1];
    *plVar1 = (long)pp_Var2;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    if (local_60[0] != (t_html_generator *)local_50) {
      operator_delete(local_60[0]);
    }
    std::__cxx11::string::string((string *)local_60,(char *)local_50._16_8_,&local_61);
    std::__cxx11::string::_M_assign
              ((string *)
               &(this->f_out_).super_ostringstream.
                super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
    this_00 = &this->f_out_;
    template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
    clear_buf(this_00);
    (this->f_out_).super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x90
         = 0;
    if (local_60[0] != (t_html_generator *)local_50) {
      operator_delete(local_60[0]);
    }
    poVar3 = this_00;
    generate_css_content(local_60[0],(ostream *)this_00);
    template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
              (this_00,(int)poVar3);
    if ((_Base_ptr *)local_50._16_8_ != &local_30) {
      operator_delete((void *)local_50._16_8_);
    }
  }
  return;
}

Assistant:

void t_html_generator::generate_css() {
  if (!standalone_) {
    current_file_ = "style.css";
    string css_fname = get_out_dir() + current_file_;
    f_out_.open(css_fname.c_str());
    generate_css_content(f_out_);
    f_out_.close();
  }
}